

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Delaunay_psm.cpp
# Opt level: O0

void GEO::Process::initialize(int flags)

{
  bool bVar1;
  index_t num_threads;
  Environment *pEVar2;
  ProcessEnvironment *this;
  ostream *poVar3;
  ThreadManager *thread_manager;
  char *pcVar4;
  allocator local_49;
  string local_48 [48];
  Environment *local_18;
  Environment *env;
  int flags_local;
  
  env._4_4_ = flags;
  pEVar2 = Environment::instance();
  local_18 = pEVar2;
  this = (ProcessEnvironment *)operator_new(0x58);
  anon_unknown.dwarf_5292d::ProcessEnvironment::ProcessEnvironment(this);
  (*(pEVar2->super_Counted)._vptr_Counted[2])(pEVar2,this);
  bVar1 = os_init_threads();
  if (!bVar1) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_48,"Process",&local_49);
    poVar3 = Logger::out((string *)local_48);
    poVar3 = std::operator<<(poVar3,"Multithreading not supported, going monothread");
    std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
    std::__cxx11::string::~string(local_48);
    std::allocator<char>::~allocator((allocator<char> *)&local_49);
    thread_manager = (ThreadManager *)operator_new(0x10);
    MonoThreadingThreadManager::MonoThreadingThreadManager
              ((MonoThreadingThreadManager *)thread_manager);
    set_thread_manager(thread_manager);
  }
  pcVar4 = getenv("GEO_NO_SIGNAL_HANDLER");
  if ((pcVar4 == (char *)0x0) && ((env._4_4_ & 1) != 0)) {
    os_install_signal_handlers();
  }
  enable_multithreading((bool)(::(anonymous_namespace)::multithreading_enabled_ & 1));
  num_threads = number_of_cores();
  set_max_threads(num_threads);
  enable_FPE((bool)(::(anonymous_namespace)::fpe_enabled_ & 1));
  enable_cancel((bool)(::(anonymous_namespace)::cancel_enabled_ & 1));
  ::(anonymous_namespace)::start_time_ = SystemStopwatch::now();
  return;
}

Assistant:

void initialize(int flags) {

            Environment* env = Environment::instance();
            env->add_environment(new ProcessEnvironment);

            if(!os_init_threads()) {
#ifdef GEO_OPENMP
                Logger::out("Process")
                    << "Using OpenMP threads"
                    << std::endl;
                set_thread_manager(new OMPThreadManager);
#else
                Logger::out("Process")
                    << "Multithreading not supported, going monothread"
                    << std::endl;
                set_thread_manager(new MonoThreadingThreadManager);
#endif
            }

	    if(
		(::getenv("GEO_NO_SIGNAL_HANDLER") == nullptr) &&
		(flags & GEOGRAM_INSTALL_HANDLERS) != 0
	    ) {
		os_install_signal_handlers();
	    }
	    
            // Initialize Process default values
            enable_multithreading(multithreading_enabled_);
            set_max_threads(number_of_cores());
            enable_FPE(fpe_enabled_);
            enable_cancel(cancel_enabled_);

            start_time_ = SystemStopwatch::now();
        }